

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogExecution.cpp
# Opt level: O1

Expression * __thiscall wasm::LogExecution::makeLogCall(LogExecution *this,Expression *curr)

{
  size_t sVar1;
  char *pcVar2;
  Index x;
  Call *left;
  Block *pBVar3;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_00;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  optional<wasm::Type> type;
  Const *local_60;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Builder local_40;
  Builder builder;
  
  x = makeLogCall::id;
  pcVar2 = DAT_010d2048;
  sVar1 = LOGGER;
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>_>
       ).super_PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>.
       super_Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>.currModule;
  makeLogCall::id = makeLogCall::id + 1;
  local_60 = Builder::makeConst<int>(&local_40,x);
  this_00 = &local_58;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (this_00,__l,(allocator_type *)((long)&builder.wasm + 7));
  target.super_IString.str._M_str = pcVar2;
  target.super_IString.str._M_len = sVar1;
  left = Builder::makeCall(&local_40,target,this_00,(Type)0x0,false);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)this_00;
  pBVar3 = Builder::makeSequence(&local_40,(Expression *)left,curr,type);
  if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Expression *)pBVar3;
}

Assistant:

Expression* makeLogCall(Expression* curr) {
    static Index id = 0;
    Builder builder(*getModule());
    return builder.makeSequence(
      builder.makeCall(LOGGER, {builder.makeConst(int32_t(id++))}, Type::none),
      curr);
  }